

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::permutations<Imath_2_5::Vec3<short>>
               (vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_> *perms)

{
  uint uVar1;
  vector<int,_std::allocator<int>_> *value_00;
  int n;
  int level;
  vector<int,_std::allocator<int>_> value;
  vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_>
  *in_stack_ffffffffffffffa8;
  undefined1 *puVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  undefined1 local_21 [33];
  
  uVar1 = Imath_2_5::Vec3<short>::dimensions();
  value_00 = (vector<int,_std::allocator<int>_> *)(ulong)uVar1;
  puVar2 = local_21;
  std::allocator<int>::allocator((allocator<int> *)0x128164);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
             ,(allocator_type *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  std::allocator<int>::~allocator((allocator<int> *)0x128184);
  uVar1 = Imath_2_5::Vec3<short>::dimensions();
  visit<Imath_2_5::Vec3<short>>
            ((int *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),(int)((ulong)puVar2 >> 0x20),
             (int)puVar2,value_00,in_stack_ffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

static void
permutations(std::vector<T> &perms)
{
    std::vector<int> value(T::dimensions());
    int level = -1;
    int n     = T::dimensions();

    visit(level, n, 0, value, perms);
}